

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

i8 wherePathSatisfiesOrderBy
             (WhereInfo *pWInfo,ExprList *pOrderBy,WherePath *pPath,u16 wctrlFlags,u16 nLoop,
             WhereLoop *pLast,Bitmask *pRevMask)

{
  ExprList_item *pEVar1;
  WhereTerm **ppWVar2;
  byte bVar3;
  ushort uVar4;
  bool bVar5;
  bool bVar6;
  uint op;
  int iVar7;
  int iVar8;
  Expr *pEVar9;
  WhereTerm *pWVar10;
  Expr *pA;
  CollSeq *pCVar11;
  Bitmask BVar12;
  byte bVar13;
  ulong uVar14;
  ulong uVar15;
  ulong uVar16;
  Index *pIVar17;
  uint uVar18;
  ulong uVar19;
  ulong uVar20;
  short sVar21;
  ulong uVar22;
  undefined6 in_register_00000082;
  u8 *puVar23;
  ulong uVar24;
  ExprList_item *pEVar25;
  ulong uVar26;
  char cVar27;
  uint local_fc;
  WhereLoop *local_f8;
  ulong local_a8;
  ulong local_88;
  uint local_80;
  ulong local_78;
  
  if (((int)CONCAT62(in_register_00000082,nLoop) == 0) ||
     ((pWInfo->pParse->db->dbOptFlags & 0x40) == 0)) {
    uVar4 = (ushort)pOrderBy->nExpr;
    uVar15 = (ulong)uVar4;
    uVar14 = 0;
    if (uVar4 < 0x40) {
      op = ((wctrlFlags >> 0xb & 1) != 0) + 0x182;
      uVar16 = ~(-1L << ((byte)uVar4 & 0x3f));
      pEVar1 = pOrderBy->a;
      cVar27 = true;
      uVar14 = 0;
      local_f8 = (WhereLoop *)0x0;
      uVar26 = 0;
      local_78 = 0;
      local_a8 = 0;
LAB_0017ad50:
      if (((!(bool)cVar27) || (uVar16 <= uVar26)) || (nLoop < uVar14)) goto LAB_0017b34a;
      if (uVar14 != 0) {
        local_a8 = local_a8 | local_f8->maskSelf;
      }
      local_f8 = pLast;
      if ((nLoop <= uVar14) || (local_f8 = pPath->aLoop[uVar14], (wctrlFlags >> 0xb & 1) == 0)) {
        if ((local_f8->wsFlags & 0x400) != 0) {
          if ((local_f8->u).vtab.isOrdered != '\0') {
            uVar26 = uVar16;
          }
LAB_0017b34a:
          uVar14 = uVar15;
          if ((uVar26 != uVar16) && (uVar14 = 0xff, !(bool)cVar27)) {
            do {
              if ((long)uVar15 < 2) goto LAB_0017b378;
              uVar15 = uVar15 - 1;
              uVar14 = uVar15;
            } while ((-1L << ((byte)uVar15 & 0x3f) | uVar26) != 0xffffffffffffffff);
          }
          goto LAB_0017b37a;
        }
        (local_f8->u).btree.nIdxCol = 0;
        iVar8 = pWInfo->pTabList->a[local_f8->iTab].iCursor;
        for (uVar19 = 0; local_88 = 1, uVar19 != uVar15; uVar19 = uVar19 + 1) {
          if ((uVar26 >> (uVar19 & 0x3f) & 1) == 0) {
            pEVar9 = sqlite3ExprSkipCollate(pEVar1[uVar19].pExpr);
            if (((pEVar9->op == 0xa2) && (pEVar9->iTable == iVar8)) &&
               (pWVar10 = sqlite3WhereFindTerm
                                    (&pWInfo->sWC,iVar8,(int)pEVar9->iColumn,~local_a8,op,
                                     (Index *)0x0), pWVar10 != (WhereTerm *)0x0)) {
              if (pWVar10->eOperator == 1) {
                uVar20 = 0;
                do {
                  if (local_f8->nLTerm == uVar20) goto LAB_0017aedc;
                  ppWVar2 = local_f8->aLTerm + uVar20;
                  uVar20 = uVar20 + 1;
                } while (pWVar10 != *ppWVar2);
              }
              if ((((pWVar10->eOperator & 0x82) == 0) || (pEVar9->iColumn < 0)) ||
                 (iVar7 = sqlite3ExprCollSeqMatch
                                    (pWInfo->pParse,pEVar1[uVar19].pExpr,pWVar10->pExpr), iVar7 != 0
                 )) {
                uVar26 = uVar26 | 1L << ((byte)uVar19 & 0x3f);
              }
            }
          }
LAB_0017aedc:
        }
        if ((local_f8->wsFlags >> 0xc & 1) == 0) {
          if ((local_f8->wsFlags >> 8 & 1) == 0) {
            pIVar17 = (local_f8->u).btree.pIndex;
            if ((pIVar17 == (Index *)0x0) || ((pIVar17->field_0x63 & 4) != 0)) goto LAB_0017b378;
            local_80 = (uint)pIVar17->nKeyCol;
            cVar27 = pIVar17->onError != '\0';
            uVar19 = (ulong)pIVar17->nColumn;
          }
          else {
            local_80 = 0;
            pIVar17 = (Index *)0x0;
            uVar19 = local_88;
          }
          uVar20 = 0;
          bVar6 = false;
          bVar13 = 0;
          bVar5 = false;
LAB_0017af9e:
          if (uVar20 != uVar19) {
            uVar24 = (ulong)(local_f8->u).btree.nEq;
            if ((uVar24 <= uVar20) || (uVar20 < local_f8->nSkip)) {
LAB_0017afd0:
              uVar18 = 1;
LAB_0017afd3:
              if (pIVar17 == (Index *)0x0) {
                bVar3 = 0;
                local_fc = 0xffffffff;
              }
              else {
                sVar21 = pIVar17->aiColumn[uVar20];
                if (sVar21 == pIVar17->pTable->iPKey) {
                  sVar21 = -1;
                }
                bVar3 = pIVar17->aSortOrder[uVar20];
                local_fc = (uint)sVar21;
                if ((((uVar24 <= uVar20) && ((bool)cVar27 != false)) && (-1 < sVar21)) &&
                   (pIVar17->pTable->aCol[local_fc].notNull == '\0')) {
                  cVar27 = false;
                }
              }
              uVar24 = 0;
              puVar23 = &pOrderBy->a[0].sortOrder;
              do {
                if (((char)uVar18 == '\0') || (uVar15 <= uVar24)) goto LAB_0017b263;
                if ((uVar26 >> (uVar24 & 0x3f) & 1) == 0) {
                  pEVar9 = ((ExprList_item *)(puVar23 + -0x18))->pExpr;
                  pA = sqlite3ExprSkipCollate(pEVar9);
                  if ((wctrlFlags & 0xc0) == 0) {
                    uVar18 = wctrlFlags & 0xc0;
                  }
                  if ((int)local_fc < -1) {
                    iVar7 = sqlite3ExprCompareSkip(pA,pIVar17->aColExpr->a[uVar20].pExpr,iVar8);
                    if (iVar7 == 0) {
                      pEVar9 = ((ExprList_item *)(puVar23 + -0x18))->pExpr;
                      goto LAB_0017b10a;
                    }
                  }
                  else if (((pA->op == 0xa2) && (pA->iTable == iVar8)) &&
                          (local_fc == (int)pA->iColumn)) {
                    if (local_fc == 0xffffffff) goto LAB_0017b1a9;
LAB_0017b10a:
                    pCVar11 = sqlite3ExprNNCollSeq(pWInfo->pParse,pEVar9);
                    iVar7 = sqlite3StrICmp(pCVar11->zName,pIVar17->azColl[uVar20]);
                    if (iVar7 == 0) goto LAB_0017b1a9;
                  }
                }
                uVar24 = uVar24 + 1;
                puVar23 = puVar23 + 0x20;
              } while( true );
            }
            pWVar10 = local_f8->aLTerm[uVar20];
            uVar4 = pWVar10->eOperator;
            if ((op & uVar4) == 0) {
              if ((uVar4 & 1) != 0) {
                uVar22 = local_88;
                do {
                  if (uVar24 <= uVar22) goto LAB_0017afd0;
                  ppWVar2 = local_f8->aLTerm + uVar22;
                  uVar22 = uVar22 + 1;
                  uVar18 = 0;
                } while ((*ppWVar2)->pExpr != pWVar10->pExpr);
                goto LAB_0017afd3;
              }
              goto LAB_0017afd0;
            }
            if ((uVar4 >> 8 & 1) != 0) {
              cVar27 = false;
            }
            goto LAB_0017b253;
          }
LAB_0017b28b:
          if (!bVar6 && cVar27 == '\0') {
            cVar27 = false;
            goto LAB_0017b32e;
          }
        }
        local_78 = local_78 | local_f8->maskSelf;
        pEVar25 = pEVar1;
        for (uVar19 = 0; uVar15 != uVar19; uVar19 = uVar19 + 1) {
          uVar20 = 1L << ((byte)uVar19 & 0x3f);
          if ((uVar26 >> (uVar19 & 0x3f) & 1) == 0) {
            pEVar9 = pEVar25->pExpr;
            BVar12 = sqlite3WhereExprUsage(&pWInfo->sMaskSet,pEVar9);
            if ((BVar12 != 0) || (iVar8 = sqlite3ExprIsConstant(pEVar9), iVar8 != 0)) {
              if ((~local_78 & BVar12) != 0) {
                uVar20 = 0;
              }
              uVar26 = uVar26 | uVar20;
            }
          }
          pEVar25 = pEVar25 + 1;
        }
        cVar27 = true;
      }
LAB_0017b32e:
      uVar14 = uVar14 + 1;
      goto LAB_0017ad50;
    }
  }
  else {
LAB_0017b378:
    uVar14 = 0;
  }
LAB_0017b37a:
  return (i8)uVar14;
LAB_0017b1a9:
  (local_f8->u).btree.nIdxCol = (short)uVar20 + 1;
  if ((char)((wctrlFlags & 0x40) >> 6) == '\0' && uVar24 < uVar15) {
    if (bVar5) {
      bVar5 = true;
      if ((bVar3 ^ bVar13) != *puVar23) {
LAB_0017b263:
        if ((uint)uVar20 < local_80) {
          cVar27 = false;
        }
        if ((uint)uVar20 == 0) {
          cVar27 = (char)uVar20;
        }
        goto LAB_0017b28b;
      }
    }
    else {
      bVar13 = *puVar23 ^ bVar3;
      bVar5 = true;
      if (*puVar23 != bVar3) {
        *pRevMask = *pRevMask | 1L << ((byte)uVar14 & 0x3f);
      }
    }
  }
  if (local_fc == 0xffffffff) {
    bVar6 = true;
  }
  uVar26 = uVar26 | 1L << (uVar24 & 0x3f);
LAB_0017b253:
  uVar20 = uVar20 + 1;
  local_88 = local_88 + 1;
  goto LAB_0017af9e;
}

Assistant:

static i8 wherePathSatisfiesOrderBy(
  WhereInfo *pWInfo,    /* The WHERE clause */
  ExprList *pOrderBy,   /* ORDER BY or GROUP BY or DISTINCT clause to check */
  WherePath *pPath,     /* The WherePath to check */
  u16 wctrlFlags,       /* WHERE_GROUPBY or _DISTINCTBY or _ORDERBY_LIMIT */
  u16 nLoop,            /* Number of entries in pPath->aLoop[] */
  WhereLoop *pLast,     /* Add this WhereLoop to the end of pPath->aLoop[] */
  Bitmask *pRevMask     /* OUT: Mask of WhereLoops to run in reverse order */
){
  u8 revSet;            /* True if rev is known */
  u8 rev;               /* Composite sort order */
  u8 revIdx;            /* Index sort order */
  u8 isOrderDistinct;   /* All prior WhereLoops are order-distinct */
  u8 distinctColumns;   /* True if the loop has UNIQUE NOT NULL columns */
  u8 isMatch;           /* iColumn matches a term of the ORDER BY clause */
  u16 eqOpMask;         /* Allowed equality operators */
  u16 nKeyCol;          /* Number of key columns in pIndex */
  u16 nColumn;          /* Total number of ordered columns in the index */
  u16 nOrderBy;         /* Number terms in the ORDER BY clause */
  int iLoop;            /* Index of WhereLoop in pPath being processed */
  int i, j;             /* Loop counters */
  int iCur;             /* Cursor number for current WhereLoop */
  int iColumn;          /* A column number within table iCur */
  WhereLoop *pLoop = 0; /* Current WhereLoop being processed. */
  WhereTerm *pTerm;     /* A single term of the WHERE clause */
  Expr *pOBExpr;        /* An expression from the ORDER BY clause */
  CollSeq *pColl;       /* COLLATE function from an ORDER BY clause term */
  Index *pIndex;        /* The index associated with pLoop */
  sqlite3 *db = pWInfo->pParse->db;  /* Database connection */
  Bitmask obSat = 0;    /* Mask of ORDER BY terms satisfied so far */
  Bitmask obDone;       /* Mask of all ORDER BY terms */
  Bitmask orderDistinctMask;  /* Mask of all well-ordered loops */
  Bitmask ready;              /* Mask of inner loops */

  /*
  ** We say the WhereLoop is "one-row" if it generates no more than one
  ** row of output.  A WhereLoop is one-row if all of the following are true:
  **  (a) All index columns match with WHERE_COLUMN_EQ.
  **  (b) The index is unique
  ** Any WhereLoop with an WHERE_COLUMN_EQ constraint on the rowid is one-row.
  ** Every one-row WhereLoop will have the WHERE_ONEROW bit set in wsFlags.
  **
  ** We say the WhereLoop is "order-distinct" if the set of columns from
  ** that WhereLoop that are in the ORDER BY clause are different for every
  ** row of the WhereLoop.  Every one-row WhereLoop is automatically
  ** order-distinct.   A WhereLoop that has no columns in the ORDER BY clause
  ** is not order-distinct. To be order-distinct is not quite the same as being
  ** UNIQUE since a UNIQUE column or index can have multiple rows that 
  ** are NULL and NULL values are equivalent for the purpose of order-distinct.
  ** To be order-distinct, the columns must be UNIQUE and NOT NULL.
  **
  ** The rowid for a table is always UNIQUE and NOT NULL so whenever the
  ** rowid appears in the ORDER BY clause, the corresponding WhereLoop is
  ** automatically order-distinct.
  */

  assert( pOrderBy!=0 );
  if( nLoop && OptimizationDisabled(db, SQLITE_OrderByIdxJoin) ) return 0;

  nOrderBy = pOrderBy->nExpr;
  testcase( nOrderBy==BMS-1 );
  if( nOrderBy>BMS-1 ) return 0;  /* Cannot optimize overly large ORDER BYs */
  isOrderDistinct = 1;
  obDone = MASKBIT(nOrderBy)-1;
  orderDistinctMask = 0;
  ready = 0;
  eqOpMask = WO_EQ | WO_IS | WO_ISNULL;
  if( wctrlFlags & WHERE_ORDERBY_LIMIT ) eqOpMask |= WO_IN;
  for(iLoop=0; isOrderDistinct && obSat<obDone && iLoop<=nLoop; iLoop++){
    if( iLoop>0 ) ready |= pLoop->maskSelf;
    if( iLoop<nLoop ){
      pLoop = pPath->aLoop[iLoop];
      if( wctrlFlags & WHERE_ORDERBY_LIMIT ) continue;
    }else{
      pLoop = pLast;
    }
    if( pLoop->wsFlags & WHERE_VIRTUALTABLE ){
      if( pLoop->u.vtab.isOrdered ) obSat = obDone;
      break;
    }else{
      pLoop->u.btree.nIdxCol = 0;
    }
    iCur = pWInfo->pTabList->a[pLoop->iTab].iCursor;

    /* Mark off any ORDER BY term X that is a column in the table of
    ** the current loop for which there is term in the WHERE
    ** clause of the form X IS NULL or X=? that reference only outer
    ** loops.
    */
    for(i=0; i<nOrderBy; i++){
      if( MASKBIT(i) & obSat ) continue;
      pOBExpr = sqlite3ExprSkipCollate(pOrderBy->a[i].pExpr);
      if( pOBExpr->op!=TK_COLUMN ) continue;
      if( pOBExpr->iTable!=iCur ) continue;
      pTerm = sqlite3WhereFindTerm(&pWInfo->sWC, iCur, pOBExpr->iColumn,
                       ~ready, eqOpMask, 0);
      if( pTerm==0 ) continue;
      if( pTerm->eOperator==WO_IN ){
        /* IN terms are only valid for sorting in the ORDER BY LIMIT 
        ** optimization, and then only if they are actually used
        ** by the query plan */
        assert( wctrlFlags & WHERE_ORDERBY_LIMIT );
        for(j=0; j<pLoop->nLTerm && pTerm!=pLoop->aLTerm[j]; j++){}
        if( j>=pLoop->nLTerm ) continue;
      }
      if( (pTerm->eOperator&(WO_EQ|WO_IS))!=0 && pOBExpr->iColumn>=0 ){
        if( sqlite3ExprCollSeqMatch(pWInfo->pParse, 
                  pOrderBy->a[i].pExpr, pTerm->pExpr)==0 ){
          continue;
        }
        testcase( pTerm->pExpr->op==TK_IS );
      }
      obSat |= MASKBIT(i);
    }

    if( (pLoop->wsFlags & WHERE_ONEROW)==0 ){
      if( pLoop->wsFlags & WHERE_IPK ){
        pIndex = 0;
        nKeyCol = 0;
        nColumn = 1;
      }else if( (pIndex = pLoop->u.btree.pIndex)==0 || pIndex->bUnordered ){
        return 0;
      }else{
        nKeyCol = pIndex->nKeyCol;
        nColumn = pIndex->nColumn;
        assert( nColumn==nKeyCol+1 || !HasRowid(pIndex->pTable) );
        assert( pIndex->aiColumn[nColumn-1]==XN_ROWID
                          || !HasRowid(pIndex->pTable));
        isOrderDistinct = IsUniqueIndex(pIndex);
      }

      /* Loop through all columns of the index and deal with the ones
      ** that are not constrained by == or IN.
      */
      rev = revSet = 0;
      distinctColumns = 0;
      for(j=0; j<nColumn; j++){
        u8 bOnce = 1; /* True to run the ORDER BY search loop */

        assert( j>=pLoop->u.btree.nEq 
            || (pLoop->aLTerm[j]==0)==(j<pLoop->nSkip)
        );
        if( j<pLoop->u.btree.nEq && j>=pLoop->nSkip ){
          u16 eOp = pLoop->aLTerm[j]->eOperator;

          /* Skip over == and IS and ISNULL terms.  (Also skip IN terms when
          ** doing WHERE_ORDERBY_LIMIT processing). 
          **
          ** If the current term is a column of an ((?,?) IN (SELECT...)) 
          ** expression for which the SELECT returns more than one column,
          ** check that it is the only column used by this loop. Otherwise,
          ** if it is one of two or more, none of the columns can be
          ** considered to match an ORDER BY term.  */
          if( (eOp & eqOpMask)!=0 ){
            if( eOp & WO_ISNULL ){
              testcase( isOrderDistinct );
              isOrderDistinct = 0;
            }
            continue;  
          }else if( ALWAYS(eOp & WO_IN) ){
            /* ALWAYS() justification: eOp is an equality operator due to the
            ** j<pLoop->u.btree.nEq constraint above.  Any equality other
            ** than WO_IN is captured by the previous "if".  So this one
            ** always has to be WO_IN. */
            Expr *pX = pLoop->aLTerm[j]->pExpr;
            for(i=j+1; i<pLoop->u.btree.nEq; i++){
              if( pLoop->aLTerm[i]->pExpr==pX ){
                assert( (pLoop->aLTerm[i]->eOperator & WO_IN) );
                bOnce = 0;
                break;
              }
            }
          }
        }

        /* Get the column number in the table (iColumn) and sort order
        ** (revIdx) for the j-th column of the index.
        */
        if( pIndex ){
          iColumn = pIndex->aiColumn[j];
          revIdx = pIndex->aSortOrder[j];
          if( iColumn==pIndex->pTable->iPKey ) iColumn = XN_ROWID;
        }else{
          iColumn = XN_ROWID;
          revIdx = 0;
        }

        /* An unconstrained column that might be NULL means that this
        ** WhereLoop is not well-ordered
        */
        if( isOrderDistinct
         && iColumn>=0
         && j>=pLoop->u.btree.nEq
         && pIndex->pTable->aCol[iColumn].notNull==0
        ){
          isOrderDistinct = 0;
        }

        /* Find the ORDER BY term that corresponds to the j-th column
        ** of the index and mark that ORDER BY term off 
        */
        isMatch = 0;
        for(i=0; bOnce && i<nOrderBy; i++){
          if( MASKBIT(i) & obSat ) continue;
          pOBExpr = sqlite3ExprSkipCollate(pOrderBy->a[i].pExpr);
          testcase( wctrlFlags & WHERE_GROUPBY );
          testcase( wctrlFlags & WHERE_DISTINCTBY );
          if( (wctrlFlags & (WHERE_GROUPBY|WHERE_DISTINCTBY))==0 ) bOnce = 0;
          if( iColumn>=XN_ROWID ){
            if( pOBExpr->op!=TK_COLUMN ) continue;
            if( pOBExpr->iTable!=iCur ) continue;
            if( pOBExpr->iColumn!=iColumn ) continue;
          }else{
            Expr *pIdxExpr = pIndex->aColExpr->a[j].pExpr;
            if( sqlite3ExprCompareSkip(pOBExpr, pIdxExpr, iCur) ){
              continue;
            }
          }
          if( iColumn!=XN_ROWID ){
            pColl = sqlite3ExprNNCollSeq(pWInfo->pParse, pOrderBy->a[i].pExpr);
            if( sqlite3StrICmp(pColl->zName, pIndex->azColl[j])!=0 ) continue;
          }
          pLoop->u.btree.nIdxCol = j+1;
          isMatch = 1;
          break;
        }
        if( isMatch && (wctrlFlags & WHERE_GROUPBY)==0 ){
          /* Make sure the sort order is compatible in an ORDER BY clause.
          ** Sort order is irrelevant for a GROUP BY clause. */
          if( revSet ){
            if( (rev ^ revIdx)!=pOrderBy->a[i].sortOrder ) isMatch = 0;
          }else{
            rev = revIdx ^ pOrderBy->a[i].sortOrder;
            if( rev ) *pRevMask |= MASKBIT(iLoop);
            revSet = 1;
          }
        }
        if( isMatch ){
          if( iColumn==XN_ROWID ){
            testcase( distinctColumns==0 );
            distinctColumns = 1;
          }
          obSat |= MASKBIT(i);
        }else{
          /* No match found */
          if( j==0 || j<nKeyCol ){
            testcase( isOrderDistinct!=0 );
            isOrderDistinct = 0;
          }
          break;
        }
      } /* end Loop over all index columns */
      if( distinctColumns ){
        testcase( isOrderDistinct==0 );
        isOrderDistinct = 1;
      }
    } /* end-if not one-row */

    /* Mark off any other ORDER BY terms that reference pLoop */
    if( isOrderDistinct ){
      orderDistinctMask |= pLoop->maskSelf;
      for(i=0; i<nOrderBy; i++){
        Expr *p;
        Bitmask mTerm;
        if( MASKBIT(i) & obSat ) continue;
        p = pOrderBy->a[i].pExpr;
        mTerm = sqlite3WhereExprUsage(&pWInfo->sMaskSet,p);
        if( mTerm==0 && !sqlite3ExprIsConstant(p) ) continue;
        if( (mTerm&~orderDistinctMask)==0 ){
          obSat |= MASKBIT(i);
        }
      }
    }
  } /* End the loop over all WhereLoops from outer-most down to inner-most */
  if( obSat==obDone ) return (i8)nOrderBy;
  if( !isOrderDistinct ){
    for(i=nOrderBy-1; i>0; i--){
      Bitmask m = MASKBIT(i) - 1;
      if( (obSat&m)==m ) return i;
    }
    return 0;
  }
  return -1;
}